

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_replace_value(JSON_Array *array,size_t ix,JSON_Value *value)

{
  size_t sVar1;
  JSON_Value *pJVar2;
  JSON_Value *value_local;
  size_t ix_local;
  JSON_Array *array_local;
  
  if ((((array != (JSON_Array *)0x0) && (value != (JSON_Value *)0x0)) &&
      (value->parent == (JSON_Value *)0x0)) && (sVar1 = json_array_get_count(array), ix < sVar1)) {
    pJVar2 = json_array_get_value(array,ix);
    json_value_free(pJVar2);
    pJVar2 = json_array_get_wrapping_value(array);
    value->parent = pJVar2;
    array->items[ix] = value;
    return 0;
  }
  return -1;
}

Assistant:

JSON_Status json_array_replace_value(JSON_Array *array, size_t ix, JSON_Value *value) {
    if (array == NULL || value == NULL || value->parent != NULL || ix >= json_array_get_count(array)) {
        return JSONFailure;
    }
    json_value_free(json_array_get_value(array, ix));
    value->parent = json_array_get_wrapping_value(array);
    array->items[ix] = value;
    return JSONSuccess;
}